

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_writescalar(t_symbol *templatesym,t_word *w,_binbuf *b,int amarrayelement)

{
  int iVar1;
  int iVar2;
  _array *p_Var3;
  t_symbol *templatesym_00;
  t_template *ptVar4;
  int local_7c;
  t_symbol *arraytemplatesym;
  int nitems;
  int elemsize;
  _array *a_1;
  undefined1 local_58 [4];
  int j;
  t_atom templatename;
  int natom;
  int n;
  int i;
  t_atom *a;
  t_template *template;
  int amarrayelement_local;
  _binbuf *b_local;
  t_word *w_local;
  t_symbol *templatesym_local;
  
  ptVar4 = template_findbyname(templatesym);
  _n = (t_atom *)getbytes(0);
  if (ptVar4 == (t_template *)0x0) {
    local_7c = 0;
  }
  else {
    local_7c = ptVar4->t_n;
  }
  templatename.a_w._4_4_ = 0;
  if (amarrayelement == 0) {
    local_58 = (undefined1  [4])0x2;
    templatename._0_8_ = gensym(templatesym->s_name + 3);
    binbuf_add(b,1,(t_atom *)local_58);
  }
  if (ptVar4 == (t_template *)0x0) {
    bug("canvas_writescalar");
  }
  for (natom = 0; natom < local_7c; natom = natom + 1) {
    if ((ptVar4->t_vec[natom].ds_type == 0) || (ptVar4->t_vec[natom].ds_type == 1)) {
      _n = (t_atom *)
           resizebytes(_n,(long)(int)templatename.a_w._4_4_ << 4,
                       (long)(templatename.a_w._4_4_ + 1) << 4);
      if (ptVar4->t_vec[natom].ds_type == 0) {
        _n[(int)templatename.a_w._4_4_].a_type = A_FLOAT;
        _n[(int)templatename.a_w._4_4_].a_w.w_float = w[natom].w_float;
      }
      else {
        _n[(int)templatename.a_w._4_4_].a_type = A_SYMBOL;
        _n[(int)templatename.a_w._4_4_].a_w = w[natom];
      }
      templatename.a_w._4_4_ = templatename.a_w._4_4_ + 1;
    }
  }
  if ((templatename.a_w._4_4_ == 0) && (amarrayelement != 0)) {
    _n->a_type = A_SYMBOL;
    (_n->a_w).w_symbol = &s_bang;
    templatename.a_w._4_4_ = 1;
  }
  binbuf_add(b,templatename.a_w._4_4_,_n);
  binbuf_addsemi(b);
  freebytes(_n,(long)(int)templatename.a_w._4_4_ << 4);
  for (natom = 0; natom < local_7c; natom = natom + 1) {
    if (ptVar4->t_vec[natom].ds_type == 3) {
      p_Var3 = w[natom].w_array;
      iVar1 = p_Var3->a_elemsize;
      iVar2 = p_Var3->a_n;
      templatesym_00 = ptVar4->t_vec[natom].ds_arraytemplate;
      for (a_1._4_4_ = 0; a_1._4_4_ < iVar2; a_1._4_4_ = a_1._4_4_ + 1) {
        canvas_writescalar(templatesym_00,(t_word *)(p_Var3->a_vec + iVar1 * a_1._4_4_),b,1);
      }
      binbuf_addsemi(b);
    }
    else if (ptVar4->t_vec[natom].ds_type == 2) {
      binbuf_savetext(w[natom].w_binbuf,b);
    }
  }
  return;
}

Assistant:

void canvas_writescalar(t_symbol *templatesym, t_word *w, t_binbuf *b,
    int amarrayelement)
{
    t_template *template = template_findbyname(templatesym);
    t_atom *a = (t_atom *)t_getbytes(0);
    int i, n = template?(template->t_n):0, natom = 0;
    if (!amarrayelement)
    {
        t_atom templatename;
        SETSYMBOL(&templatename, gensym(templatesym->s_name + 3));
        binbuf_add(b, 1, &templatename);
    }
    if (!template)
        bug("canvas_writescalar");
        /* write the atoms (floats and symbols) */
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_FLOAT ||
            template->t_vec[i].ds_type == DT_SYMBOL)
        {
            a = (t_atom *)t_resizebytes(a,
                natom * sizeof(*a), (natom + 1) * sizeof (*a));
            if (template->t_vec[i].ds_type == DT_FLOAT)
                SETFLOAT(a + natom, w[i].w_float);
            else SETSYMBOL(a + natom,  w[i].w_symbol);
            natom++;
        }
    }
        /* array elements have to have at least something */
    if (natom == 0 && amarrayelement)
        SETSYMBOL(a + natom,  &s_bang), natom++;
    binbuf_add(b, natom, a);
    binbuf_addsemi(b);
    t_freebytes(a, natom * sizeof(*a));
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_ARRAY)
        {
            int j;
            t_array *a = w[i].w_array;
            int elemsize = a->a_elemsize, nitems = a->a_n;
            t_symbol *arraytemplatesym = template->t_vec[i].ds_arraytemplate;
            for (j = 0; j < nitems; j++)
                canvas_writescalar(arraytemplatesym,
                    (t_word *)(((char *)a->a_vec) + elemsize * j), b, 1);
            binbuf_addsemi(b);
        }
        else if (template->t_vec[i].ds_type == DT_TEXT)
            binbuf_savetext(w[i].w_binbuf, b);
    }
}